

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gbabus.c
# Opt level: O0

void on_waitcnt_updated(void)

{
  byte bVar1;
  ushort uVar2;
  int local_1c;
  int local_14;
  int local_c;
  int local_4;
  
  uVar2 = (bus->WAITCNT).raw;
  switch((bus->WAITCNT).raw >> 2 & 3) {
  case 0:
    local_4 = 4;
    break;
  case 1:
    local_4 = 3;
    break;
  case 2:
    local_4 = 2;
    break;
  case 3:
    local_4 = 8;
    break;
  default:
    fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
            "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/gbabus.c",0x1e9
           );
    fprintf(_stderr,"Invalid nonsequential WAITCNT setting: %d!\n\x1b[0;m",(ulong)(uVar2 >> 2 & 3));
    exit(1);
  }
  nonsequential_byte_half_cycles[8] = local_4;
  nonsequential_byte_half_cycles[9] = local_4;
  sequential_byte_half_cycles[8] = 2 - (uint)(((bus->WAITCNT).raw >> 4 & 1) != 0);
  sequential_byte_half_cycles[9] = 2 - (uint)(((bus->WAITCNT).raw >> 4 & 1) != 0);
  nonsequential_word_cycles[8] = local_4 + sequential_byte_half_cycles[8];
  sequential_word_cycles[9] = sequential_byte_half_cycles[8] * 2;
  uVar2 = (bus->WAITCNT).raw;
  switch((bus->WAITCNT).raw >> 2 & 3) {
  case 0:
    local_c = 4;
    break;
  case 1:
    local_c = 3;
    break;
  case 2:
    local_c = 2;
    break;
  case 3:
    local_c = 8;
    break;
  default:
    fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
            "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/gbabus.c",0x1e9
           );
    fprintf(_stderr,"Invalid nonsequential WAITCNT setting: %d!\n\x1b[0;m",(ulong)(uVar2 >> 5 & 3));
    exit(1);
  }
  nonsequential_byte_half_cycles[10] = local_c;
  nonsequential_byte_half_cycles[0xb] = local_c;
  sequential_byte_half_cycles[10] = (uint)(((ushort)bus->WAITCNT & 0x80) == 0) * 3 + 1;
  sequential_byte_half_cycles[0xb] = (uint)(((ushort)bus->WAITCNT & 0x80) == 0) * 3 + 1;
  nonsequential_word_cycles[10] = local_c + sequential_byte_half_cycles[10];
  sequential_word_cycles[0xb] = sequential_byte_half_cycles[10] * 2;
  bVar1 = *(byte *)((long)&bus->WAITCNT + 1);
  switch((bus->WAITCNT).raw >> 2 & 3) {
  case 0:
    local_14 = 4;
    break;
  case 1:
    local_14 = 3;
    break;
  case 2:
    local_14 = 2;
    break;
  case 3:
    local_14 = 8;
    break;
  default:
    fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
            "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/gbabus.c",0x1e9
           );
    fprintf(_stderr,"Invalid nonsequential WAITCNT setting: %d!\n\x1b[0;m",(ulong)(bVar1 & 3));
    exit(1);
  }
  nonsequential_byte_half_cycles[0xc] = local_14;
  nonsequential_byte_half_cycles[0xd] = local_14;
  sequential_byte_half_cycles[0xd] = 8;
  sequential_byte_half_cycles[0xc] = 8;
  if ((*(uint *)&bus->WAITCNT >> 10 & 1) != 0) {
    sequential_byte_half_cycles[0xc] = 1;
  }
  if ((*(uint *)&bus->WAITCNT >> 10 & 1) != 0) {
    sequential_byte_half_cycles[0xd] = 1;
  }
  nonsequential_word_cycles[0xc] = local_14 + sequential_byte_half_cycles[0xc];
  sequential_word_cycles[0xd] = sequential_byte_half_cycles[0xc] * 2;
  uVar2 = (bus->WAITCNT).raw;
  switch((bus->WAITCNT).raw >> 2 & 3) {
  case 0:
    local_1c = 4;
    break;
  case 1:
    local_1c = 3;
    break;
  case 2:
    local_1c = 2;
    break;
  case 3:
    local_1c = 8;
    break;
  default:
    fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
            "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/gbabus.c",0x1e9
           );
    fprintf(_stderr,"Invalid nonsequential WAITCNT setting: %d!\n\x1b[0;m",(ulong)(uVar2 & 3));
    exit(1);
  }
  nonsequential_byte_half_cycles[0xe] = local_1c;
  nonsequential_byte_half_cycles[0xf] = local_1c;
  sequential_byte_half_cycles[0xe] = local_1c;
  sequential_byte_half_cycles[0xf] = local_1c;
  nonsequential_word_cycles[0xe] = local_1c * 2;
  sequential_word_cycles[0xe] = local_1c * 2;
  nonsequential_word_cycles[0xf] = local_1c * 2;
  sequential_word_cycles[0xf] = local_1c * 2;
  return;
}

Assistant:

void on_waitcnt_updated() {
    nonsequential_byte_half_cycles[REGION_GAMEPAK0_L] = nonsequential_waitstates(bus->WAITCNT.wait_state_0_nonsequential);
    nonsequential_byte_half_cycles[REGION_GAMEPAK0_H] = nonsequential_byte_half_cycles[REGION_GAMEPAK0_L];
    sequential_byte_half_cycles[REGION_GAMEPAK0_L] = bus->WAITCNT.wait_state_0_sequential ? 1 : 2;
    sequential_byte_half_cycles[REGION_GAMEPAK0_H] = bus->WAITCNT.wait_state_0_sequential ? 1 : 2;
    nonsequential_word_cycles[REGION_GAMEPAK0_L] = nonsequential_byte_half_cycles[REGION_GAMEPAK0_L] + sequential_byte_half_cycles[REGION_GAMEPAK0_L];
    sequential_word_cycles[REGION_GAMEPAK0_H] = sequential_byte_half_cycles[REGION_GAMEPAK0_L] * 2;

    nonsequential_byte_half_cycles[REGION_GAMEPAK1_L] = nonsequential_waitstates(bus->WAITCNT.wait_state_1_nonsequential);
    nonsequential_byte_half_cycles[REGION_GAMEPAK1_H] = nonsequential_byte_half_cycles[REGION_GAMEPAK1_L];
    sequential_byte_half_cycles[REGION_GAMEPAK1_L] = bus->WAITCNT.wait_state_1_sequential ? 1 : 4;
    sequential_byte_half_cycles[REGION_GAMEPAK1_H] = bus->WAITCNT.wait_state_1_sequential ? 1 : 4;
    nonsequential_word_cycles[REGION_GAMEPAK1_L] = nonsequential_byte_half_cycles[REGION_GAMEPAK1_L] + sequential_byte_half_cycles[REGION_GAMEPAK1_L];
    sequential_word_cycles[REGION_GAMEPAK1_H] = sequential_byte_half_cycles[REGION_GAMEPAK1_L] * 2;

    nonsequential_byte_half_cycles[REGION_GAMEPAK2_L] = nonsequential_waitstates(bus->WAITCNT.wait_state_2_nonsequential);
    nonsequential_byte_half_cycles[REGION_GAMEPAK2_H] = nonsequential_byte_half_cycles[REGION_GAMEPAK2_L];
    sequential_byte_half_cycles[REGION_GAMEPAK2_L] = bus->WAITCNT.wait_state_2_sequential ? 1 : 8;
    sequential_byte_half_cycles[REGION_GAMEPAK2_H] = bus->WAITCNT.wait_state_2_sequential ? 1 : 8;
    nonsequential_word_cycles[REGION_GAMEPAK2_L] = nonsequential_byte_half_cycles[REGION_GAMEPAK2_L] + sequential_byte_half_cycles[REGION_GAMEPAK2_L];
    sequential_word_cycles[REGION_GAMEPAK2_H] = sequential_byte_half_cycles[REGION_GAMEPAK2_L] * 2;

    nonsequential_byte_half_cycles[REGION_SRAM] = nonsequential_waitstates(bus->WAITCNT.sram_wait);
    nonsequential_byte_half_cycles[REGION_SRAM_MIRR] = nonsequential_byte_half_cycles[REGION_SRAM];
    sequential_byte_half_cycles[REGION_SRAM] = nonsequential_byte_half_cycles[REGION_SRAM];
    sequential_byte_half_cycles[REGION_SRAM_MIRR] = nonsequential_byte_half_cycles[REGION_SRAM];
    nonsequential_word_cycles[REGION_SRAM] = nonsequential_byte_half_cycles[REGION_SRAM] + sequential_byte_half_cycles[REGION_SRAM];
    sequential_word_cycles[REGION_SRAM] = sequential_byte_half_cycles[REGION_SRAM] + sequential_byte_half_cycles[REGION_SRAM];
    nonsequential_word_cycles[REGION_SRAM_MIRR] = nonsequential_word_cycles[REGION_SRAM];
    sequential_word_cycles[REGION_SRAM_MIRR] = sequential_word_cycles[REGION_SRAM];
}